

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_LabelForMap_Test::
~ParseErrorTest_LabelForMap_Test(ParseErrorTest_LabelForMap_Test *this)

{
  ParseErrorTest_LabelForMap_Test *this_local;
  
  ~ParseErrorTest_LabelForMap_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, LabelForMap) {
  ExpectHasErrors(
      "message TestMessage {\n"
      "  optional map<int32, int32> int_map = 1;\n"
      "  required map<int32, int32> int_map2 = 2;\n"
      "  repeated map<int32, int32> int_map3 = 3;\n"
      "  optional map map_message = 4;\n"  // a normal message field is OK
      "}\n",
      "1:14: Field labels (required/optional/repeated) are not allowed on map "
      "fields.\n"
      "2:14: Field labels (required/optional/repeated) are not allowed on map "
      "fields.\n"
      "3:14: Field labels (required/optional/repeated) are not allowed on map "
      "fields.\n");
}